

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

size_t mserialize::detail::
       BuiltinSerializer<std::tuple<std::tuple<int,int>,std::tuple<int,int>>,void>::
       serialized_size_impl<0ul,1ul>(void)

{
  size_t sVar1;
  long lVar2;
  long local_38 [4];
  size_t elem_sizes [3];
  
  elem_sizes[1] = 0;
  elem_sizes[0] = 0;
  local_38[0] = 0;
  local_38[1] = 4;
  local_38[2] = 4;
  lVar2 = 0;
  do {
    elem_sizes[1] = elem_sizes[1] + *(long *)((long)local_38 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  local_38[0] = 0;
  local_38[1] = 4;
  local_38[2] = 4;
  elem_sizes[2] = 0;
  lVar2 = 0;
  do {
    elem_sizes[2] = elem_sizes[2] + *(long *)((long)local_38 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  sVar1 = 0;
  lVar2 = 0;
  do {
    sVar1 = sVar1 + *(long *)((long)elem_sizes + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  return sVar1;
}

Assistant:

static std::size_t serialized_size_impl(const Tuple<E...>& t, std::index_sequence<I...>)
  {
    using std::get;
    const std::size_t elem_sizes[] = {0, mserialize::serialized_size(get<I>(t))...};

    std::size_t result = 0;
    for (auto s : elem_sizes) { result += s; }
    return result;
  }